

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_details.hpp
# Opt level: O3

void __thiscall
so_5::mchain_props::
mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
::mchain_template<so_5::msg_tracing::tracer_t&>
          (mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
           *this,environment_t *env,mbox_id_t id,mchain_params_t *params,tracer_t *tracing_args)

{
  size_t sVar1;
  undefined8 uVar2;
  rep rVar3;
  
  abstract_message_chain_t::abstract_message_chain_t((abstract_message_chain_t *)this);
  *(tracer_t **)(this + 0x10) = tracing_args;
  *(undefined ***)this = &PTR__mchain_template_002867e0;
  *(environment_t **)(this + 0x18) = env;
  *(undefined4 *)(this + 0x20) = 0;
  *(mbox_id_t *)(this + 0x28) = id;
  sVar1 = (params->m_capacity).m_max_size;
  uVar2 = *(undefined8 *)&(params->m_capacity).m_memory;
  rVar3 = (params->m_capacity).m_overflow_timeout.__r;
  *(undefined8 *)(this + 0x30) = *(undefined8 *)&params->m_capacity;
  *(size_t *)(this + 0x38) = sVar1;
  *(undefined8 *)(this + 0x40) = uVar2;
  *(rep *)(this + 0x48) = rVar3;
  std::function<void_()>::function
            ((function<void_()> *)(this + 0x50),&params->m_not_empty_notificator);
  details::limited_preallocated_demand_queue::limited_preallocated_demand_queue
            ((limited_preallocated_demand_queue *)(this + 0x70),&params->m_capacity);
  *(undefined8 *)(this + 0xc0) = 0;
  *(undefined8 *)(this + 0xa0) = 0;
  *(undefined8 *)(this + 0xa8) = 0;
  *(undefined8 *)(this + 0xb0) = 0;
  *(undefined8 *)(this + 0xb8) = 0;
  std::condition_variable::condition_variable((condition_variable *)(this + 200));
  std::condition_variable::condition_variable((condition_variable *)(this + 0xf8));
  *(undefined8 *)(this + 0x128) = 0;
  *(undefined8 *)(this + 0x130) = 0;
  return;
}

Assistant:

mchain_template(
			//! SObjectizer Environment for which message chain is created.
			so_5::environment_t & env,
			//! Mbox ID for this chain.
			mbox_id_t id,
			//! Chain parameters.
			const mchain_params_t & params,
			//! Arguments for TRACING_BASE's constructor.
			TRACING_ARGS &&... tracing_args )
			:	TRACING_BASE( std::forward<TRACING_ARGS>(tracing_args)... )
			,	m_env( env )
			,	m_id( id )
			,	m_capacity( params.capacity() )
			,	m_not_empty_notificator( params.not_empty_notificator() )
			,	m_queue( params.capacity() )
			{}